

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall slang::IntervalMapDetails::Path::legalizeForInsert(Path *this,uint32_t level)

{
  uint32_t *puVar1;
  pointer pEVar2;
  
  if (((this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len == 0) ||
     (pEVar2 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar2->size <= pEVar2->offset)) {
    moveLeft(this,level);
    puVar1 = &(this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
              [level].offset;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void legalizeForInsert(uint32_t level) {
        if (valid())
            return;

        moveLeft(level);
        ++path[level].offset;
    }